

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O1

void __thiscall antlr::Parser::match(Parser *this,BitSet *b)

{
  bool bVar1;
  int iVar2;
  uint el;
  int numTokens_;
  long *plVar3;
  ostream *poVar4;
  MismatchedTokenException *this_00;
  undefined4 extraout_var;
  RefToken local_80;
  string local_78;
  BitSet local_58;
  
  if (DEBUG_PARSER == '\x01') {
    (*this->_vptr_Parser[0x1b])(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"enter match(",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bitset",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") with LA(1)=",0xd);
    iVar2 = (*this->_vptr_Parser[2])(this,1);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  el = (*this->_vptr_Parser[2])(this,1);
  bVar1 = BitSet::member(b,el);
  if (bVar1) {
    (*this->_vptr_Parser[0xc])(this);
    return;
  }
  if (DEBUG_PARSER == '\x01') {
    (*this->_vptr_Parser[0x1b])(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"token mismatch: ",0x10);
    iVar2 = (*this->_vptr_Parser[2])(this,1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," not member of ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"bitset",6);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  this_00 = (MismatchedTokenException *)__cxa_allocate_exception(200);
  iVar2 = (*this->_vptr_Parser[0x19])(this);
  numTokens_ = (*this->_vptr_Parser[0x1a])(this);
  (*this->_vptr_Parser[3])(&local_80,this,1);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58.storage,&b->storage);
  (*this->_vptr_Parser[8])(&local_78,this);
  MismatchedTokenException::MismatchedTokenException
            (this_00,(char **)CONCAT44(extraout_var,iVar2),numTokens_,&local_80,&local_58,false,
             &local_78);
  __cxa_throw(this_00,&MismatchedTokenException::typeinfo,
              MismatchedTokenException::~MismatchedTokenException);
}

Assistant:

virtual void match(const BitSet& b)
	{
		if ( DEBUG_PARSER )
		{
			traceIndent();
			ANTLR_USE_NAMESPACE(std)cout << "enter match(" << "bitset" /*b.toString()*/
				<< ") with LA(1)=" << LA(1) << ANTLR_USE_NAMESPACE(std)endl;
		}
		if ( !b.member(LA(1)) )
		{
			if ( DEBUG_PARSER )
			{
				traceIndent();
				ANTLR_USE_NAMESPACE(std)cout << "token mismatch: " << LA(1) << " not member of "
					<< "bitset" /*b.toString()*/ << ANTLR_USE_NAMESPACE(std)endl;
			}
			throw MismatchedTokenException(getTokenNames(), getNumTokens(), LT(1), b, false, getFilename());
		}
		else
		{
			// mark token as consumed -- fetch next token deferred until LA/LT
			consume();
		}
	}